

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::compressFaces(SurfaceMesh *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_type __new_size;
  _List_node_base *p_Var1;
  _func_int **pp_Var2;
  SurfaceMesh *this_01;
  _func_int **pp_Var3;
  bool bVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newBLIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _func_int **local_80;
  pointer local_68;
  _List_node_base *p_Stack_60;
  _List_node_base *local_58;
  unsigned_long local_50;
  _List_node_base *local_48;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (_List_node_base *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = (pointer)0x0;
  p_Stack_60 = (_List_node_base *)0x0;
  p_Var1 = (_List_node_base *)&stack0xffffffffffffff80;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8,
             this->nFacesCapacityCount,&INVALID_IND,(allocator_type *)p_Var1);
  this_00 = &this->fHalfedgeArr;
  pp_Var3 = (_func_int **)0x0;
  while( true ) {
    local_80 = pp_Var3;
    if ((_func_int **)this->nFacesCapacityCount <= pp_Var3) break;
    pp_Var2 = (_func_int **)((long)this->nFacesCapacityCount - this->nBoundaryLoopsFillCount);
    bVar4 = pp_Var3 < (_func_int **)this->nFacesFillCount;
    p_Var1 = (_List_node_base *)CONCAT71((int7)((ulong)p_Var1 >> 8),bVar4 || pp_Var2 <= pp_Var3);
    if ((bVar4 || pp_Var2 <= pp_Var3) &&
       ((this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[(long)pp_Var3] != 0xffffffffffffffff)) {
      (&local_48->_M_next)[(long)pp_Var3] =
           (_List_node_base *)
           ((long)local_98._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98._M_impl.super__Vector_impl_data._M_start >> 3);
      p_Var1 = local_48;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                 (value_type_conflict1 *)&stack0xffffffffffffff80);
      if (pp_Var2 <= pp_Var3) {
        local_50 = ~(ulong)local_80 + this->nFacesCapacityCount;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98
                   ,&stack0xffffffffffffffb0);
      }
    }
    pp_Var3 = (_func_int **)((long)local_80 + 1);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff80,
             (geometrycentral *)this_00,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var1);
  this_01 = (SurfaceMesh *)&stack0xffffffffffffff80;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(this_00,this_01);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  updateValues(this_01,&this->heFaceArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
  __new_size = this->nFacesCount;
  this->nFacesFillCount = __new_size;
  this->nFacesCapacityCount = this->nBoundaryLoopsCount + __new_size;
  this->nBoundaryLoopsFillCount = this->nBoundaryLoopsCount;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,__new_size);
  p_Var1 = (_List_node_base *)&this->facePermuteCallbackList;
  while (p_Var1 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->facePermuteCallbackList) {
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                *)(p_Var1 + 1),(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98);
  }
  p_Var1 = (_List_node_base *)&this->boundaryLoopPermuteCallbackList;
  while (p_Var1 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->boundaryLoopPermuteCallbackList) {
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                *)(p_Var1 + 1),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98);
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void SurfaceMesh::compressFaces() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newBLIndMap;                                 // maps BL new ind -> old ind
  std::vector<size_t> oldIndMap(nFacesCapacityCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nFacesCapacityCount; i++) {
    bool isBL = (i >= nFacesCapacityCount - nBoundaryLoopsFillCount);
    if (i < nFacesFillCount || isBL) { // skip gap between faces and BLs
      if (!faceIsDead(i)) {
        oldIndMap[i] = newIndMap.size();
        newIndMap.push_back(i);

        if (isBL) {
          newBLIndMap.push_back(faceIndToBoundaryLoopInd(i));
        }
      }
    }
  }


  // Permute & resize all per-face arrays
  fHalfedgeArr = applyPermutation(fHalfedgeArr, newIndMap);

  // Update indices in all face-valued arrays
  updateValues(heFaceArr, oldIndMap);

  // Update counts
  nFacesFillCount = nFacesCount;
  nFacesCapacityCount = nFacesCount + nBoundaryLoopsCount;
  nBoundaryLoopsFillCount = nBoundaryLoopsCount;

  // Invoke callbacks
  newIndMap.resize(nFacesCount); // truncate all boundary loop entries, so this array now just holds values for faces
  for (auto& f : facePermuteCallbackList) {
    f(newIndMap);
  }
  for (auto& f : boundaryLoopPermuteCallbackList) {
    f(newBLIndMap);
  }
}